

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cpp
# Opt level: O0

Ptr<Surface> myvk::Surface::Create(Ptr<Instance> *instance,GLFWwindow *window)

{
  VkResult VVar1;
  element_type *peVar2;
  element_type *this;
  GLFWwindow *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VkInstance_conflict in_RSI;
  element_type *in_RDI;
  Ptr<Surface> PVar3;
  shared_ptr<myvk::Surface> ret;
  shared_ptr<myvk::Instance> *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  element_type *handle;
  
  handle = in_RDI;
  std::make_shared<myvk::Surface>();
  std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x296fc3);
  std::shared_ptr<myvk::Instance>::operator=
            ((shared_ptr<myvk::Instance> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
            );
  peVar2 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x296fe8);
  peVar2->m_window = in_RDX;
  std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x296ffb);
  this = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )0x297007);
  Instance::GetHandle(this);
  std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x297029);
  VVar1 = glfwCreateWindowSurface
                    (in_RSI,(GLFWwindow *)handle,(VkAllocationCallbacks *)in_RDI,
                     (VkSurfaceKHR_conflict *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (VVar1 == VK_SUCCESS) {
    std::shared_ptr<myvk::Surface>::shared_ptr
              ((shared_ptr<myvk::Surface> *)(ulong)in_stack_ffffffffffffff90,
               (shared_ptr<myvk::Surface> *)in_RDX);
  }
  else {
    std::shared_ptr<myvk::Surface>::shared_ptr
              ((shared_ptr<myvk::Surface> *)CONCAT44(VVar1,in_stack_ffffffffffffff90),in_RDX);
  }
  std::shared_ptr<myvk::Surface>::~shared_ptr((shared_ptr<myvk::Surface> *)0x2970a4);
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = handle;
  return (Ptr<Surface>)PVar3.super___shared_ptr<myvk::Surface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Surface> Surface::Create(const Ptr<Instance> &instance, GLFWwindow *window) {
	auto ret = std::make_shared<Surface>();
	ret->m_instance_ptr = instance;
	ret->m_window = window;
	if (glfwCreateWindowSurface(ret->m_instance_ptr->GetHandle(), window, nullptr, &ret->m_surface) != VK_SUCCESS)
		return nullptr;
	return ret;
}